

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_sink.c
# Opt level: O2

int sink_phidep(jit_State *J,IRRef ref,int *workp)

{
  IRIns *pIVar1;
  int iVar2;
  uint ref_00;
  ulong uVar3;
  
  iVar2 = 1;
  if (*workp != 0) {
    pIVar1 = (J->cur).ir;
    uVar3 = (ulong)ref;
    *workp = *workp + -1;
    if ((*(byte *)((long)pIVar1 + uVar3 * 8 + 4) & 0x40) == 0) {
      if ((0x8000 < pIVar1[uVar3].field_0.op1) &&
         (iVar2 = sink_phidep(J,(uint)pIVar1[uVar3].field_0.op1,workp), iVar2 != 0)) {
        return 1;
      }
      ref_00 = (uint)*(ushort *)((long)pIVar1 + uVar3 * 8 + 2);
      if ((0x8000 < ref_00) && (iVar2 = sink_phidep(J,ref_00,workp), iVar2 != 0)) {
        return 1;
      }
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int sink_phidep(jit_State *J, IRRef ref, int *workp)
{
  IRIns *ir = IR(ref);
  if (!*workp) return 1;  /* Give up and pretend it does. */
  (*workp)--;
  if (irt_isphi(ir->t)) return 1;
  if (ir->op1 >= REF_FIRST && sink_phidep(J, ir->op1, workp)) return 1;
  if (ir->op2 >= REF_FIRST && sink_phidep(J, ir->op2, workp)) return 1;
  return 0;
}